

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O1

void __thiscall Camera::updateCameraVectors(Camera *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  fVar7 = cosf(this->Yaw * 0.017453292);
  fVar8 = cosf(this->Pitch * 0.017453292);
  fVar9 = sinf(this->Pitch * 0.017453292);
  fVar10 = sinf(this->Yaw * 0.017453292);
  fVar11 = cosf(this->Pitch * 0.017453292);
  fVar8 = fVar8 * fVar7;
  fVar11 = fVar11 * fVar10;
  fVar7 = fVar11 * fVar11 + fVar9 * fVar9 + fVar8 * fVar8;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  fVar7 = 1.0 / fVar7;
  (this->Front).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(fVar7 * fVar8);
  (this->Front).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(fVar7 * fVar9);
  (this->Front).field_2.z = fVar11 * fVar7;
  fVar7 = (this->WorldUp).field_0.x;
  fVar8 = (this->Front).field_0.x;
  uVar1 = (this->WorldUp).field_1;
  uVar4 = (this->WorldUp).field_2;
  uVar2 = (this->Front).field_1;
  uVar5 = (this->Front).field_2;
  fVar9 = (float)uVar4 * (float)uVar2 - (float)uVar5 * (float)uVar1;
  fVar10 = fVar7 * (float)uVar5 - fVar8 * (float)uVar4;
  fVar8 = fVar8 * (float)uVar1 - (float)uVar2 * fVar7;
  fVar7 = fVar10 * fVar10 + fVar9 * fVar9 + fVar8 * fVar8;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  fVar7 = 1.0 / fVar7;
  fVar8 = fVar8 * fVar7;
  (this->Right).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(fVar9 * fVar7);
  (this->Right).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(fVar10 * fVar7);
  (this->Right).field_2.z = fVar8;
  fVar7 = (this->Right).field_0.x;
  fVar9 = (this->Right).field_1.y;
  fVar10 = (this->Front).field_0.x;
  uVar3 = (this->Front).field_1;
  uVar6 = (this->Front).field_2;
  fVar11 = (float)uVar6 * fVar9 - fVar8 * (float)uVar3;
  fVar12 = fVar10 * fVar8 - fVar7 * (float)uVar6;
  fVar8 = fVar7 * (float)uVar3 - fVar9 * fVar10;
  fVar7 = fVar12 * fVar12 + fVar11 * fVar11 + fVar8 * fVar8;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  fVar7 = 1.0 / fVar7;
  (this->Up).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(fVar11 * fVar7);
  (this->Up).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(fVar12 * fVar7);
  (this->Up).field_2.z = fVar8 * fVar7;
  return;
}

Assistant:

void Camera::updateCameraVectors() {
    vec3 front;
    front.x = cos(radians(Yaw)) * cos(radians(Pitch));
    front.y = sin(radians(Pitch));
    front.z = sin(radians(Yaw)) * cos(radians(Pitch));

    Front = normalize(front);

    Right = normalize(cross(Front, WorldUp));
    Up = normalize((cross(Right, Front)));
}